

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O0

void __thiscall Population::add_creature(Population *this,Creature *crt)

{
  Creature *this_00;
  type this_01;
  double local_40 [3];
  undefined1 local_28 [8];
  shared_ptr<Creature> nc;
  Creature *crt_local;
  Population *this_local;
  
  nc.pn.pi_ = (sp_counted_base *)crt;
  this_00 = (Creature *)operator_new(0x50);
  Creature::Creature(this_00,(Creature *)nc.pn.pi_);
  boost::shared_ptr<Creature>::shared_ptr<Creature>((shared_ptr<Creature> *)local_28,this_00);
  std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>::push_back
            (&this->creats,(shared_ptr<Creature> *)local_28);
  this_01 = boost::shared_ptr<Creature>::operator->((shared_ptr<Creature> *)local_28);
  local_40[0] = Creature::get_fitness(this_01);
  std::vector<double,_std::allocator<double>_>::push_back(&this->fitdict,local_40);
  boost::shared_ptr<Creature>::~shared_ptr((shared_ptr<Creature> *)local_28);
  return;
}

Assistant:

void Population::add_creature( const Creature& crt )
{
	boost::shared_ptr<Creature> nc(new Creature(crt));
	creats.push_back(nc);

	fitdict.push_back(nc->get_fitness());
}